

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

bool __thiscall
wasm::OptimizeInstructions::trapOnNull(OptimizeInstructions *this,Expression *curr,Expression **ref)

{
  ulong uVar1;
  Expression *pEVar2;
  bool bVar3;
  Id IVar4;
  Index IVar5;
  Drop *pDVar6;
  Expression **ppEVar7;
  HeapType heapType;
  Expression *pEVar8;
  Block *pBVar9;
  Drop *pDVar10;
  Builder in_RCX;
  byte bVar11;
  AbstractChildIterator<wasm::ChildIterator> *pAVar12;
  Iterator IVar13;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  Type local_200;
  anon_class_8_1_8991fb9c flowsOutNull;
  bool local_1ec;
  bool local_11d;
  size_t local_d8;
  size_t local_a8;
  AbstractChildIterator<wasm::ChildIterator> local_a0;
  AbstractChildIterator<wasm::ChildIterator> *local_60;
  Iterator local_58;
  Expression *local_48;
  Builder local_40;
  Builder builder;
  
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  pEVar8 = *ref;
  local_48 = curr;
  builder.wasm = (Module *)ref;
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).trapsNeverHappen == true) {
    IVar4 = pEVar8->_id;
    local_200.id = (uintptr_t)this;
    if (IVar4 == IfId) {
      if (*(long *)(pEVar8 + 2) != 0) {
        bVar3 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&stack0xfffffffffffffe00,
                           (Expression *)pEVar8[1].type.id);
        if (bVar3) {
          in_RCX.wasm = *(Module **)(pEVar8 + 2);
          if ((_Head_base<0UL,_wasm::Export_*,_false>)
              *(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
               &((builder.wasm)->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> !=
              (_Head_base<0UL,_wasm::Export_*,_false>)
              ((in_RCX.wasm)->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            this->refinalize = true;
          }
          pDVar6 = Builder::makeDrop(&local_40,*(Expression **)(pEVar8 + 1));
          pEVar8 = *(Expression **)(pEVar8 + 2);
        }
        else {
          bVar3 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)&stack0xfffffffffffffe00,
                             *(Expression **)(pEVar8 + 2));
          pEVar2 = (Expression *)
                   ((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (!bVar3) {
            IVar4 = pEVar2->_id;
            in_RCX = builder;
            pEVar8 = pEVar2;
            goto LAB_00aec0c1;
          }
          in_RCX.wasm = (Module *)(pEVar2->type).id;
          if (in_RCX.wasm != *(Module **)(pEVar8[1].type.id + 8)) {
            this->refinalize = true;
          }
          pDVar6 = Builder::makeDrop(&local_40,*(Expression **)(pEVar8 + 1));
          pEVar8 = (Expression *)pEVar8[1].type.id;
        }
LAB_00aec334:
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)in_RCX.wasm;
        pBVar9 = Builder::makeSequence(&local_40,(Expression *)pDVar6,pEVar8,type);
LAB_00aec33c:
        ((builder.wasm)->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar9;
        return false;
      }
    }
    else {
LAB_00aec0c1:
      if (IVar4 == SelectId) {
        bVar3 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&stack0xfffffffffffffe00,
                           *(Expression **)(pEVar8 + 1));
        pEVar2 = (Expression *)pEVar8[1].type.id;
        if ((bVar3) && ((pEVar2->type).id != 1)) {
          pDVar6 = Builder::makeDrop(&local_40,*(Expression **)(pEVar8 + 1));
          pEVar2 = (Expression *)pEVar8[1].type.id;
          pDVar10 = Builder::makeDrop(&local_40,*(Expression **)(pEVar8 + 2));
          pEVar8 = getResultOfFirst(this,pEVar2,(Expression *)pDVar10);
          goto LAB_00aec334;
        }
        bVar3 = trapOnNull::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&stack0xfffffffffffffe00,pEVar2);
        if ((bVar3) && (pEVar2 = *(Expression **)(pEVar8 + 1), (pEVar2->type).id != 1)) {
          pDVar6 = Builder::makeDrop(&local_40,(Expression *)pEVar8[1].type.id);
          pDVar10 = Builder::makeDrop(&local_40,*(Expression **)(pEVar8 + 2));
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)in_RCX.wasm;
          pBVar9 = Builder::makeSequence
                             (&local_40,(Expression *)pDVar6,(Expression *)pDVar10,type_00);
          pBVar9 = (Block *)getResultOfFirst(this,pEVar2,(Expression *)pBVar9);
          goto LAB_00aec33c;
        }
      }
    }
    pEVar8 = (Expression *)
             ((builder.wasm)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar1 = (pEVar8->type).id;
  if ((((uint)uVar1 & 3) == 2 && 6 < uVar1) && (pEVar8->_id == RefCastId)) {
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_a0,local_48);
    local_58.index = 0;
    local_58.parent = &local_a0;
    IVar13 = AbstractChildIterator<wasm::ChildIterator>::end(&local_a0);
    local_60 = IVar13.parent;
    IVar5 = 0;
    bVar11 = 0;
    pAVar12 = &local_a0;
LAB_00aec168:
    if ((IVar5 == IVar13.index) && (pAVar12 == local_60)) {
      std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                (&local_a0.children.flexible.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
      heapType = wasm::Type::getHeapType(&pEVar8->type);
      wasm::Type::Type(&stack0xfffffffffffffe00,heapType,NonNullable,Inexact);
      (pEVar8->type).id = local_200.id;
      goto LAB_00aec2ab;
    }
    ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_58);
    pEVar2 = *ppEVar7;
    bVar3 = pEVar2 == (Expression *)
                      ((builder.wasm)->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if ((bool)(~bVar11 & 1) || bVar3) {
      bVar11 = bVar11 | bVar3;
    }
    else {
      if ((((this->
            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
            ).super_Pass.runner)->options).trapsNeverHappen != true) goto LAB_00aec2a2;
      effects((EffectAnalyzer *)&stack0xfffffffffffffe00,this,pEVar2);
      if (((local_1ec != false) || (local_11d != false)) || (local_a8 != 0)) {
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&stack0xfffffffffffffe00);
LAB_00aec2a2:
        std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                  (&local_a0.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
        goto LAB_00aec2ab;
      }
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&stack0xfffffffffffffe00);
      if (local_d8 != 0) goto LAB_00aec2a2;
    }
    IVar5 = local_58.index + 1;
    pAVar12 = local_58.parent;
    local_58.index = IVar5;
    goto LAB_00aec168;
  }
LAB_00aec2ab:
  pEVar8 = getFallthrough(this,(Expression *)
                               ((builder.wasm)->exports).
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  bVar3 = wasm::Type::isNull(&pEVar8->type);
  if (!bVar3) {
    return false;
  }
  pEVar8 = (Expression *)MixedArena::alloc<wasm::Unreachable>(&(local_40.wasm)->allocator);
  pEVar8 = getDroppedChildrenAndAppend(this,local_48,pEVar8);
  replaceCurrent(this,pEVar8);
  return true;
}

Assistant:

bool trapOnNull(Expression* curr, Expression*& ref) {
    Builder builder(*getModule());

    if (getPassOptions().trapsNeverHappen) {
      // We can ignore the possibility of the reference being an input, so
      //
      //    (if
      //      (condition)
      //      (null)
      //      (other))
      // =>
      //    (drop
      //      (condition))
      //    (other)
      //
      // That is, we will by assumption not read from the null, so remove that
      // arm.
      //
      // TODO We could recurse here.
      // TODO We could do similar things for casts (rule out an impossible arm).
      // TODO Worth thinking about an 'assume' instrinsic of some form that
      //      annotates knowledge about a value, or another mechanism to allow
      //      that information to be passed around.

      // Note that we must check that the null is actually flowed out, that is,
      // that control flow is not transferred before:
      //
      //    (if
      //      (1)
      //      (block (result null)
      //        (return)
      //      )
      //      (other))
      //
      // The true arm has a bottom type, but in fact it just returns out of the
      // function and the null does not actually flow out. We can only optimize
      // here if a null definitely flows out (as only that would cause a trap).
      auto flowsOutNull = [&](Expression* child) {
        return child->type.isNull() && !effects(child).transfersControlFlow();
      };

      if (auto* iff = ref->dynCast<If>()) {
        if (iff->ifFalse) {
          if (flowsOutNull(iff->ifTrue)) {
            if (ref->type != iff->ifFalse->type) {
              refinalize = true;
            }
            ref = builder.makeSequence(builder.makeDrop(iff->condition),
                                       iff->ifFalse);
            return false;
          }
          if (flowsOutNull(iff->ifFalse)) {
            if (ref->type != iff->ifTrue->type) {
              refinalize = true;
            }
            ref = builder.makeSequence(builder.makeDrop(iff->condition),
                                       iff->ifTrue);
            return false;
          }
        }
      }

      if (auto* select = ref->dynCast<Select>()) {
        // We must check for unreachability explicitly here because a full
        // refinalize only happens at the end. That is, the select may stil be
        // reachable after we turned one child into an unreachable, and we are
        // calling getResultOfFirst which will error on unreachability.
        if (flowsOutNull(select->ifTrue) &&
            select->ifFalse->type != Type::unreachable) {
          ref = builder.makeSequence(
            builder.makeDrop(select->ifTrue),
            getResultOfFirst(select->ifFalse,
                             builder.makeDrop(select->condition)));
          return false;
        }
        if (flowsOutNull(select->ifFalse) &&
            select->ifTrue->type != Type::unreachable) {
          ref = getResultOfFirst(
            select->ifTrue,
            builder.makeSequence(builder.makeDrop(select->ifFalse),
                                 builder.makeDrop(select->condition)));
          return false;
        }
      }
    }

    // A nullable cast can be turned into a non-nullable one:
    //
    //    (struct.get ;; or something else that traps on a null ref
    //      (ref.cast null
    // =>
    //    (struct.get
    //      (ref.cast      ;; now non-nullable
    //
    // Either way we trap here, but refining the type may have benefits later.
    if (ref->type.isNullable()) {
      if (auto* cast = ref->dynCast<RefCast>()) {
        // Note that we must be the last child of the parent, otherwise effects
        // in the middle may need to remain:
        //
        //    (struct.set
        //      (ref.cast null
        //      (call ..
        //
        // The call here must execute before the trap in the struct.set. To
        // avoid that problem, inspect all children after us. If there are no
        // such children, then there is no problem; if there are, see below.
        auto canOptimize = true;
        auto seenRef = false;
        for (auto* child : ChildIterator(curr)) {
          if (child == ref) {
            seenRef = true;
          } else if (seenRef) {
            // This is a child after the reference. Check it for effects. For
            // simplicity, focus on the case of traps-never-happens: if we can
            // assume no trap occurs in the parent, then there must not be a
            // trap in the child either, unless control flow transfers and we
            // might not reach the parent.
            // TODO: handle more cases.
            if (!getPassOptions().trapsNeverHappen ||
                effects(child).transfersControlFlow()) {
              canOptimize = false;
              break;
            }
          }
        }
        if (canOptimize) {
          cast->type = Type(cast->type.getHeapType(), NonNullable);
        }
      }
    }

    auto fallthrough = getFallthrough(ref);

    if (fallthrough->type.isNull()) {
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, builder.makeUnreachable()));
      return true;
    }
    return false;
  }